

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

TextureCube * __thiscall tcu::TextureCube::operator=(TextureCube *this,TextureCube *other)

{
  bool bVar1;
  reference pvVar2;
  EVP_PKEY_CTX *dst;
  ConstPixelBufferAccess *src;
  CubeFace local_a0;
  int local_9c;
  int face_1;
  int levelNdx;
  int local_5c;
  int face;
  ConstPixelBufferAccess *levels [6];
  int numLevels;
  TextureCube *other_local;
  TextureCube *this_local;
  
  if (this != other) {
    levels[5]._4_4_ = computeMipPyramidLevels(other->m_size);
    for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
      std::
      vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ::resize(this->m_data + local_5c,(long)levels[5]._4_4_);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
                (this->m_access + local_5c,(long)levels[5]._4_4_);
      pvVar2 = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
               operator[](this->m_access + local_5c,0);
      *(reference *)(&stack0xffffffffffffffa8 + (long)local_5c * 8) = pvVar2;
    }
    this->m_format = other->m_format;
    this->m_size = other->m_size;
    TextureCubeView::TextureCubeView
              ((TextureCubeView *)&face_1,levels[5]._4_4_,
               (ConstPixelBufferAccess *(*) [6])&stack0xffffffffffffffa8);
    memcpy(&this->m_view,&face_1,0x38);
    for (local_9c = 0; local_9c < levels[5]._4_4_; local_9c = local_9c + 1) {
      for (local_a0 = CUBEFACE_NEGATIVE_X; (int)local_a0 < 6;
          local_a0 = local_a0 + CUBEFACE_POSITIVE_X) {
        bVar1 = isLevelEmpty(this,local_a0,local_9c);
        if (!bVar1) {
          clearLevel(this,local_a0,local_9c);
        }
        bVar1 = isLevelEmpty(other,local_a0,local_9c);
        if (!bVar1) {
          allocLevel(this,local_a0,local_9c);
          dst = (EVP_PKEY_CTX *)getLevelFace(this,local_9c,local_a0);
          src = getLevelFace(other,local_9c,local_a0);
          copy(dst,(EVP_PKEY_CTX *)src);
        }
      }
    }
  }
  return this;
}

Assistant:

TextureCube& TextureCube::operator= (const TextureCube& other)
{
	if (this == &other)
		return *this;

	const int						numLevels		= computeMipPyramidLevels(other.m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_format	= other.m_format;
	m_size		= other.m_size;
	m_view		= TextureCubeView(numLevels, levels);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < CUBEFACE_LAST; face++)
		{
			if (!isLevelEmpty((CubeFace)face, levelNdx))
				clearLevel((CubeFace)face, levelNdx);

			if (!other.isLevelEmpty((CubeFace)face, levelNdx))
			{
				allocLevel((CubeFace)face, levelNdx);
				copy(getLevelFace(levelNdx, (CubeFace)face),
					 other.getLevelFace(levelNdx, (CubeFace)face));
			}
		}
	}

	return *this;
}